

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::Tex2DShader::shadeFragments
          (Tex2DShader *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  const_reference pvVar1;
  float x_;
  float y_;
  Vector<float,_4> *local_d8;
  float *local_b8;
  int local_ac;
  Vector<float,_2> VStack_a8;
  int fragNdx_1;
  undefined1 local_a0 [8];
  Vec4 coord;
  int fragNdx;
  int packetNdx;
  Vec4 colors [4];
  Vec2 texCoords [4];
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  Tex2DShader *this_local;
  
  local_b8 = colors[3].m_data + 2;
  texCoords[3].m_data = (float  [2])context;
  do {
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)local_b8);
    local_b8 = local_b8 + 2;
  } while ((Vec2 *)local_b8 != texCoords + 3);
  local_d8 = (Vector<float,_4> *)&fragNdx;
  do {
    tcu::Vector<float,_4>::Vector(local_d8);
    local_d8 = local_d8 + 1;
  } while (local_d8 != (Vector<float,_4> *)(colors[3].m_data + 2));
  for (coord.m_data[3] = 0.0; (int)coord.m_data[3] < numPackets;
      coord.m_data[3] = (float)((int)coord.m_data[3] + 1)) {
    for (coord.m_data[2] = 0.0; (int)coord.m_data[2] < 4;
        coord.m_data[2] = (float)((int)coord.m_data[2] + 1)) {
      rr::readTriangleVarying<float>
                ((rr *)local_a0,packets + (int)coord.m_data[3],
                 (FragmentShadingContext *)texCoords[3].m_data,0,(int)coord.m_data[2]);
      x_ = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_a0);
      y_ = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_a0);
      tcu::Vector<float,_2>::Vector(&stack0xffffffffffffff58,x_,y_);
      *&texCoords[(long)(int)coord.m_data[2] + -1].m_data = VStack_a8.m_data;
    }
    pvVar1 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                       (&(this->super_ShaderProgram).m_uniforms,0);
    sglr::rc::Texture2D::sample4
              ((pvVar1->sampler).tex2D,(Vec4 *)&fragNdx,(Vec2 *)(colors[3].m_data + 2),0.0);
    for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                ((FragmentShadingContext *)texCoords[3].m_data,(int)coord.m_data[3],local_ac,0,
                 (Vector<float,_4> *)(&fragNdx + (long)local_ac * 4));
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec2 texCoords[4];
		tcu::Vec4 colors[4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			// setup tex coords
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			{
				const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
				texCoords[fragNdx] = tcu::Vec2(coord.x(), coord.y());
			}

			// Sample
			m_uniforms[0].sampler.tex2D->sample4(colors, texCoords);

			// Write out
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, colors[fragNdx]);
		}
	}